

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_array.h
# Opt level: O0

ngx_int_t ngx_array_init(ngx_array_t *array,ngx_pool_t *pool,ngx_uint_t n,size_t size)

{
  void *pvVar1;
  size_t size_local;
  ngx_uint_t n_local;
  ngx_pool_t *pool_local;
  ngx_array_t *array_local;
  
  array->nelts = 0;
  array->size = size;
  array->nalloc = n;
  array->pool = pool;
  pvVar1 = ngx_palloc(pool,n * size);
  array->elts = pvVar1;
  if (array->elts == (void *)0x0) {
    array_local = (ngx_array_t *)0xffffffffffffffff;
  }
  else {
    array_local = (ngx_array_t *)0x0;
  }
  return (ngx_int_t)array_local;
}

Assistant:

static ngx_inline ngx_int_t
ngx_array_init(ngx_array_t *array, ngx_pool_t *pool, ngx_uint_t n, size_t size)
{
    /*
     * set "array->nelts" before "array->elts", otherwise MSVC thinks
     * that "array->nelts" may be used without having been initialized
     */

    array->nelts = 0;
    array->size = size;
    array->nalloc = n;
    array->pool = pool;

    array->elts = ngx_palloc(pool, n * size);
    if (array->elts == NULL) {
        return NGX_ERROR;
    }

    return NGX_OK;
}